

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O3

void Diligent::PipelineStateUtils::
     ExtractShaders<Diligent::ShaderVkImpl,std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>>>
               (ComputePipelineStateCreateInfo *CreateInfo,
               vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
               *ShaderStages,bool WaitUntilShadersReady,SHADER_TYPE *ActiveShaderStages)

{
  int iVar1;
  undefined4 extraout_var;
  char (*Args_1) [60];
  IShader *pIVar2;
  string msg;
  RefCntAutoPtr<Diligent::ShaderVkImpl> pShaderImpl;
  string local_50;
  RefCntAutoPtr<Diligent::ShaderVkImpl> local_30;
  
  Args_1 = (char (*) [60])ActiveShaderStages;
  if ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType != PIPELINE_TYPE_COMPUTE) {
    FormatString<char[26],char[39]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.PSODesc.IsComputePipeline()",
               (char (*) [39])ActiveShaderStages);
    Args_1 = (char (*) [60])0x101;
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x101);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
  ::_M_erase_at_end(ShaderStages,
                    (ShaderStages->
                    super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                    )._M_impl.super__Vector_impl_data._M_start);
  if ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType != PIPELINE_TYPE_COMPUTE) {
    FormatString<char[26],char[57]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.PSODesc.PipelineType == PIPELINE_TYPE_COMPUTE",
               (char (*) [57])Args_1);
    Args_1 = (char (*) [60])0x105;
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x105);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  pIVar2 = CreateInfo->pCS;
  if (pIVar2 == (IShader *)0x0) {
    FormatString<char[26],char[26]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.pCS != nullptr",(char (*) [26])Args_1);
    Args_1 = (char (*) [60])0x106;
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x106);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    pIVar2 = CreateInfo->pCS;
  }
  iVar1 = (*(pIVar2->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  if (*(int *)(CONCAT44(extraout_var,iVar1) + 8) != 0x20) {
    FormatString<char[26],char[60]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.pCS->GetDesc().ShaderType == SHADER_TYPE_COMPUTE",Args_1);
    Args_1 = (char (*) [60])0x107;
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x107);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  pIVar2 = CreateInfo->pCS;
  local_30.m_pObject = (ShaderVkImpl *)0x0;
  if (pIVar2 != (IShader *)0x0) {
    (**(pIVar2->super_IDeviceObject).super_IObject._vptr_IObject)
              (pIVar2,ShaderVkImpl::IID_InternalImpl,&local_30);
    if (local_30.m_pObject != (ShaderVkImpl *)0x0) goto LAB_002160da;
  }
  FormatString<char[40]>(&local_50,(char (*) [40])"Unexpected shader object implementation");
  Args_1 = (char (*) [60])0x10a;
  DebugAssertionFailed
            (local_50._M_dataplus._M_p,"ExtractShaders",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
             ,0x10a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
LAB_002160da:
  WaitUntilShaderReadyIfRequested<Diligent::ShaderVkImpl>(&local_30,WaitUntilShadersReady);
  std::
  vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>>
  ::emplace_back<Diligent::RefCntAutoPtr<Diligent::ShaderVkImpl>&>
            ((vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>>
              *)ShaderStages,&local_30);
  *ActiveShaderStages = SHADER_TYPE_COMPUTE;
  if ((ShaderStages->
      super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (ShaderStages->
      super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    FormatString<char[26],char[22]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"!ShaderStages.empty()",(char (*) [22])Args_1);
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x10f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  RefCntAutoPtr<Diligent::ShaderVkImpl>::Release(&local_30);
  return;
}

Assistant:

void ExtractShaders(const ComputePipelineStateCreateInfo& CreateInfo,
                    TShaderStages&                        ShaderStages,
                    bool                                  WaitUntilShadersReady,
                    SHADER_TYPE&                          ActiveShaderStages)
{
    VERIFY_EXPR(CreateInfo.PSODesc.IsComputePipeline());

    ShaderStages.clear();

    VERIFY_EXPR(CreateInfo.PSODesc.PipelineType == PIPELINE_TYPE_COMPUTE);
    VERIFY_EXPR(CreateInfo.pCS != nullptr);
    VERIFY_EXPR(CreateInfo.pCS->GetDesc().ShaderType == SHADER_TYPE_COMPUTE);

    RefCntAutoPtr<ShaderImplType> pShaderImpl{CreateInfo.pCS, ShaderImplType::IID_InternalImpl};
    VERIFY(pShaderImpl, "Unexpected shader object implementation");
    WaitUntilShaderReadyIfRequested(pShaderImpl, WaitUntilShadersReady);
    ShaderStages.emplace_back(pShaderImpl);
    ActiveShaderStages = SHADER_TYPE_COMPUTE;

    VERIFY_EXPR(!ShaderStages.empty());
}